

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O3

QWidget * __thiscall QMdiSubWindow::maximizedButtonsWidget(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  ViewMode VVar3;
  QMdiArea *this_01;
  QObject *pQVar4;
  
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
    pDVar1 = (this_00->controlContainer).wp.d;
    if (((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
         ((this_00->controlContainer).wp.value != (QObject *)0x0)) &&
        ((bVar2 = QWidget::isMaximized(&this->super_QWidget), bVar2 &&
         (bVar2 = QMdiSubWindowPrivate::drawTitleBarWhenMaximized(this_00), !bVar2)))) &&
       ((this_01 = mdiArea(this), this_01 == (QMdiArea *)0x0 ||
        (VVar3 = QMdiArea::viewMode(this_01), VVar3 != TabbedView)))) {
      pDVar1 = (this_00->controlContainer).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = (this_00->controlContainer).wp.value;
      }
      if ((*(long *)(pQVar4 + 0x40) != 0) && (*(int *)(*(long *)(pQVar4 + 0x40) + 4) != 0)) {
        return *(QWidget **)(pQVar4 + 0x48);
      }
    }
  }
  return (QWidget *)0x0;
}

Assistant:

inline bool QWidget::testAttribute(Qt::WidgetAttribute attribute) const
{
    if (attribute < int(8*sizeof(uint)))
        return data->widget_attributes & (1<<attribute);
    return testAttribute_helper(attribute);
}